

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

int libssh2_userauth_hostbased_fromfile_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,char *publickey,char *privatekey,
              char *passphrase,char *host,uint host_len,char *localuser,uint localuser_len)

{
  uchar **buf_00;
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr **pp_Var1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  time_t start_time;
  uchar *puVar5;
  char *pcVar6;
  long lVar7;
  size_t sVar8;
  LIBSSH2_HOSTKEY_METHOD *pLVar9;
  size_t sig_len;
  uchar *sig;
  void *abstract;
  LIBSSH2_HOSTKEY_METHOD *privkeyobj;
  uchar buf [5];
  iovec datavec [4];
  size_t local_100;
  uchar *local_f8;
  size_t local_f0;
  uchar *local_e8;
  void *local_e0;
  char *local_d8;
  char *local_d0;
  uchar **local_c8;
  size_t *local_c0;
  uchar **local_b8;
  ulong local_b0;
  char *local_a8;
  long local_a0;
  packet_requirev_state_t *local_98;
  char *local_90;
  LIBSSH2_HOSTKEY_METHOD *local_88;
  uchar local_7d [5];
  iovec local_78;
  uchar *local_68;
  ulong local_60;
  uchar *local_58;
  size_t local_50;
  
  pLVar9 = (LIBSSH2_HOSTKEY_METHOD *)(ulong)host_len;
  local_d8 = privatekey;
  local_d0 = passphrase;
  local_a8 = user;
  local_90 = publickey;
  start_time = time((time_t *)0x0);
  local_b8 = &session->userauth_host_method;
  local_c0 = &session->userauth_host_method_len;
  local_a0 = (long)&pLVar9->name + (ulong)localuser_len + (ulong)user_len;
  buf_00 = &session->userauth_host_s;
  local_c8 = &session->userauth_host_data;
  local_98 = &session->userauth_host_packet_requirev_state;
  local_b0 = (ulong)user_len;
  do {
    if (session->userauth_host_state == libssh2_NB_state_idle) {
      local_f8 = (uchar *)0x0;
      local_e8 = (uchar *)0x0;
      local_100 = 0;
      local_f0 = 0;
      (session->userauth_host_packet_requirev_state).start = 0;
      if (local_90 == (char *)0x0) {
        uVar3 = _libssh2_pub_priv_keyfile
                          (session,local_b8,local_c0,&local_f8,&local_100,local_d8,local_d0);
      }
      else {
        uVar3 = file_read_publickey(session,local_b8,local_c0,&local_f8,&local_100,local_90);
      }
      if (uVar3 == 0) {
        lVar7 = local_a0 + session->userauth_host_method_len;
        session->userauth_host_packet_len = local_100 + lVar7 + 0x34;
        puVar5 = (uchar *)(*session->alloc)(local_100 * 2 + session->userauth_host_method_len +
                                            lVar7 + 0x40,&session->abstract);
        session->userauth_host_packet = puVar5;
        session->userauth_host_s = puVar5;
        if (puVar5 == (uchar *)0x0) {
          (*session->free)(session->userauth_host_method,&session->abstract);
          session->userauth_host_method = (uchar *)0x0;
          (*session->free)(local_f8,&session->abstract);
          uVar3 = _libssh2_error(session,-6,"Out of memory");
          goto LAB_0012b727;
        }
        session->userauth_host_s = puVar5 + 1;
        *puVar5 = '2';
        _libssh2_store_str(buf_00,local_a8,local_b0);
        _libssh2_store_str(buf_00,"ssh-connection",0xe);
        _libssh2_store_str(buf_00,"hostbased",9);
        _libssh2_store_str(buf_00,(char *)session->userauth_host_method,
                           session->userauth_host_method_len);
        _libssh2_store_str(buf_00,(char *)local_f8,local_100);
        (*session->free)(local_f8,&session->abstract);
        _libssh2_store_str(buf_00,host,(ulong)host_len);
        _libssh2_store_str(buf_00,localuser,(ulong)localuser_len);
        uVar3 = file_read_privatekey
                          (session,&local_88,&local_e0,session->userauth_host_method,
                           session->userauth_host_method_len,local_d8,local_d0);
        if (uVar3 == 0) {
          _libssh2_htonu32(local_7d,session->session_id_len);
          pLVar9 = local_88;
          local_78.iov_len = 4;
          local_68 = session->session_id;
          local_60 = (ulong)session->session_id_len;
          local_58 = session->userauth_host_packet;
          local_50 = session->userauth_host_packet_len;
          local_78.iov_base = local_7d;
          if (local_88 == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
LAB_0012bbbc:
            if (local_100 < local_f0) {
              sVar8 = session->userauth_host_method_len +
                      local_f0 + session->userauth_host_packet_len + 0xc;
              if (session->userauth_host_packet == (uchar *)0x0) {
                puVar5 = (uchar *)(*session->alloc)(sVar8,&session->abstract);
              }
              else {
                puVar5 = (uchar *)(*session->realloc)(session->userauth_host_packet,sVar8,
                                                      &session->abstract);
              }
              if (puVar5 == (uchar *)0x0) {
                (*session->free)(local_e8,&session->abstract);
                (*session->free)(session->userauth_host_packet,&session->abstract);
                session->userauth_host_packet = (uchar *)0x0;
                (*session->free)(session->userauth_host_method,&session->abstract);
                session->userauth_host_method = (uchar *)0x0;
                uVar3 = _libssh2_error(session,-6,
                                       "Failed allocating additional space for userauth-hostbased packet"
                                      );
                pLVar9 = (LIBSSH2_HOSTKEY_METHOD *)(ulong)uVar3;
                goto LAB_0012b72a;
              }
              session->userauth_host_packet = puVar5;
            }
            session->userauth_host_s =
                 session->userauth_host_packet + session->userauth_host_packet_len;
            _libssh2_store_u32(buf_00,(int)session->userauth_host_method_len + (int)local_f0 + 8);
            _libssh2_store_str(buf_00,(char *)session->userauth_host_method,
                               session->userauth_host_method_len);
            (*session->free)(session->userauth_host_method,&session->abstract);
            session->userauth_host_method = (uchar *)0x0;
            _libssh2_store_str(buf_00,(char *)local_e8,local_f0);
            (*session->free)(local_e8,&session->abstract);
            session->userauth_host_state = libssh2_NB_state_created;
            bVar2 = true;
            goto LAB_0012b72c;
          }
          if ((local_88->signv ==
               (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_ptr_size_t_ptr_int_iovec_ptr_void_ptr_ptr *)
               0x0) || (iVar4 = (*local_88->signv)(session,&local_e8,&local_f0,3,&local_78,&local_e0
                                                  ), iVar4 == 0)) {
            if (pLVar9->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
              (*pLVar9->dtor)(session,&local_e0);
            }
            goto LAB_0012bbbc;
          }
          (*session->free)(session->userauth_host_method,&session->abstract);
          bVar2 = false;
          session->userauth_host_method = (uchar *)0x0;
          (*session->free)(session->userauth_host_packet,&session->abstract);
          session->userauth_host_packet = (uchar *)0x0;
          pp_Var1 = &pLVar9->dtor;
          pLVar9 = (LIBSSH2_HOSTKEY_METHOD *)0xffffffff;
          if (*pp_Var1 == (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) goto LAB_0012b72c;
          (**pp_Var1)(session,&local_e0);
          goto LAB_0012b72a;
        }
        pLVar9 = (LIBSSH2_HOSTKEY_METHOD *)(ulong)uVar3;
        (*session->free)(session->userauth_host_method,&session->abstract);
        bVar2 = false;
        session->userauth_host_method = (uchar *)0x0;
        (*session->free)(session->userauth_host_packet,&session->abstract);
        session->userauth_host_packet = (uchar *)0x0;
      }
      else {
LAB_0012b727:
        pLVar9 = (LIBSSH2_HOSTKEY_METHOD *)(ulong)uVar3;
LAB_0012b72a:
        bVar2 = false;
      }
LAB_0012b72c:
      if (bVar2) goto LAB_0012b734;
    }
    else {
LAB_0012b734:
      if (session->userauth_host_state == libssh2_NB_state_created) {
        iVar4 = _libssh2_transport_send
                          (session,session->userauth_host_packet,
                           (long)session->userauth_host_s - (long)session->userauth_host_packet,
                           (uchar *)0x0,0);
        if (iVar4 == 0) {
          (*session->free)(session->userauth_host_packet,&session->abstract);
          session->userauth_host_packet = (uchar *)0x0;
          session->userauth_host_state = libssh2_NB_state_sent;
          goto LAB_0012b911;
        }
        if (iVar4 == -0x25) {
          iVar4 = -0x25;
          pcVar6 = "Would block";
        }
        else {
          (*session->free)(session->userauth_host_packet,&session->abstract);
          session->userauth_host_packet = (uchar *)0x0;
          session->userauth_host_state = libssh2_NB_state_idle;
          iVar4 = -7;
          pcVar6 = "Unable to send userauth-hostbased request";
        }
      }
      else {
LAB_0012b911:
        if (session->userauth_host_state == libssh2_NB_state_sent) {
          iVar4 = _libssh2_packet_requirev
                            (session,"43",local_c8,(size_t *)&local_78,0,(uchar *)0x0,0,local_98);
          if (iVar4 == -0x25) {
            iVar4 = -0x25;
            pcVar6 = "Would block";
LAB_0012b9fd:
            uVar3 = _libssh2_error(session,iVar4,pcVar6);
            pLVar9 = (LIBSSH2_HOSTKEY_METHOD *)(ulong)uVar3;
            bVar2 = false;
          }
          else {
            session->userauth_host_state = libssh2_NB_state_idle;
            if ((iVar4 != 0) || ((uchar *)local_78.iov_base == (uchar *)0x0)) {
              iVar4 = -0x13;
              pcVar6 = "Auth failed";
              goto LAB_0012b9fd;
            }
            bVar2 = true;
            if (**local_c8 == '4') {
              (*session->free)(*local_c8,&session->abstract);
              session->userauth_host_data = (uchar *)0x0;
              *(byte *)&session->state = (byte)session->state | 8;
              bVar2 = false;
              pLVar9 = (LIBSSH2_HOSTKEY_METHOD *)0x0;
            }
          }
          if (!bVar2) goto LAB_0012ba3b;
        }
        (*session->free)(session->userauth_host_data,&session->abstract);
        session->userauth_host_data = (uchar *)0x0;
        iVar4 = -0x13;
        pcVar6 = "Invalid signature for supplied public key, or bad username/public key combination"
        ;
      }
      uVar3 = _libssh2_error(session,iVar4,pcVar6);
      pLVar9 = (LIBSSH2_HOSTKEY_METHOD *)(ulong)uVar3;
    }
LAB_0012ba3b:
    iVar4 = (int)pLVar9;
    if (session == (LIBSSH2_SESSION *)0x0) {
      return iVar4;
    }
    if (iVar4 != -0x25) {
      return iVar4;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar4 = _libssh2_wait_socket(session,start_time);
    if (iVar4 != 0) {
      return iVar4;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_userauth_hostbased_fromfile_ex(LIBSSH2_SESSION *session,
                                       const char *user,
                                       unsigned int user_len,
                                       const char *publickey,
                                       const char *privatekey,
                                       const char *passphrase,
                                       const char *host,
                                       unsigned int host_len,
                                       const char *localuser,
                                       unsigned int localuser_len)
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_hostbased_fromfile(session, user, user_len,
                                             publickey, privatekey,
                                             passphrase, host, host_len,
                                             localuser, localuser_len));
    return rc;
}